

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga.c
# Opt level: O0

void xc_gga_sanity_check(xc_func_info_type *info,int order,xc_gga_out_params *out)

{
  long *in_RDX;
  uint in_ESI;
  long in_RDI;
  
  if (((int)in_ESI < 0) || (4 < (int)in_ESI)) {
    fprintf(_stderr,"Order of derivatives \'%d\' not implemented\n",(ulong)in_ESI);
    exit(1);
  }
  if ((*in_RDX != 0) && ((*(uint *)(in_RDI + 0x40) & 1) == 0)) {
    fprintf(_stderr,"Functional \'%s\' does not provide an implementation of Exc\n",
            *(undefined8 *)(in_RDI + 8));
    exit(1);
  }
  if (in_RDX[1] != 0) {
    if ((*(uint *)(in_RDI + 0x40) & 2) == 0) {
      fprintf(_stderr,"Functional \'%s\' does not provide an implementation of vxc\n",
              *(undefined8 *)(in_RDI + 8));
      exit(1);
    }
    if (in_RDX[2] == 0) {
      fprintf(_stderr,"error: output variable, out->vsigma, is a null pointer\n");
      exit(1);
    }
  }
  if (in_RDX[3] != 0) {
    if ((*(uint *)(in_RDI + 0x40) & 4) == 0) {
      fprintf(_stderr,"Functional \'%s\' does not provide an implementation of fxc\n",
              *(undefined8 *)(in_RDI + 8));
      exit(1);
    }
    if (in_RDX[4] == 0) {
      fprintf(_stderr,"error: output variable, out->v2rhosigma, is a null pointer\n");
      exit(1);
    }
    if (in_RDX[5] == 0) {
      fprintf(_stderr,"error: output variable, out->v2sigma2, is a null pointer\n");
      exit(1);
    }
  }
  if (in_RDX[6] != 0) {
    if ((*(uint *)(in_RDI + 0x40) & 8) == 0) {
      fprintf(_stderr,"Functional \'%s\' does not provide an implementation of kxc\n",
              *(undefined8 *)(in_RDI + 8));
      exit(1);
    }
    if (in_RDX[7] == 0) {
      fprintf(_stderr,"error: output variable, out->v3rho2sigma, is a null pointer\n");
      exit(1);
    }
    if (in_RDX[8] == 0) {
      fprintf(_stderr,"error: output variable, out->v3rhosigma2, is a null pointer\n");
      exit(1);
    }
    if (in_RDX[9] == 0) {
      fprintf(_stderr,"error: output variable, out->v3sigma3, is a null pointer\n");
      exit(1);
    }
  }
  if (in_RDX[10] != 0) {
    if ((*(uint *)(in_RDI + 0x40) & 0x10) == 0) {
      fprintf(_stderr,"Functional \'%s\' does not provide an implementation of lxc\n",
              *(undefined8 *)(in_RDI + 8));
      exit(1);
    }
    if (in_RDX[0xb] == 0) {
      fprintf(_stderr,"error: output variable, out->v4rho3sigma, is a null pointer\n");
      exit(1);
    }
    if (in_RDX[0xc] == 0) {
      fprintf(_stderr,"error: output variable, out->v4rho2sigma2, is a null pointer\n");
      exit(1);
    }
    if (in_RDX[0xd] == 0) {
      fprintf(_stderr,"error: output variable, out->v4rhosigma3, is a null pointer\n");
      exit(1);
    }
    if (in_RDX[0xe] == 0) {
      fprintf(_stderr,"error: output variable, out->v4sigma4, is a null pointer\n");
      exit(1);
    }
  }
  return;
}

Assistant:

void
xc_gga_sanity_check(const xc_func_info_type *info, int order, xc_gga_out_params *out)
{
  /* sanity check */
  if(order < 0 || order > 4){
    fprintf(stderr, "Order of derivatives '%d' not implemented\n",
	    order);
    exit(1);
  }
  
  /* sanity check */
  if(out->zk != NULL && !(info->flags & XC_FLAGS_HAVE_EXC)){
    fprintf(stderr, "Functional '%s' does not provide an implementation of Exc\n",
	    info->name);
    exit(1);
  }

  if(out->vrho != NULL){
    if(!(info->flags & XC_FLAGS_HAVE_VXC)){
      fprintf(stderr, "Functional '%s' does not provide an implementation of vxc\n",
              info->name);
      exit(1);
    }
    check_out_var(vsigma);
  }

  if(out->v2rho2 != NULL){
    if(!(info->flags & XC_FLAGS_HAVE_FXC)){
      fprintf(stderr, "Functional '%s' does not provide an implementation of fxc\n",
              info->name);
      exit(1);
    }
    check_out_var(v2rhosigma); 
    check_out_var(v2sigma2);
  }

  if(out->v3rho3){
    if(!(info->flags & XC_FLAGS_HAVE_KXC)){
      fprintf(stderr, "Functional '%s' does not provide an implementation of kxc\n",
              info->name);
      exit(1);
    }
    check_out_var(v3rho2sigma);
    check_out_var(v3rhosigma2);
    check_out_var(v3sigma3);
  }

  if(out->v4rho4 != NULL){
    if(!(info->flags & XC_FLAGS_HAVE_LXC)){
      fprintf(stderr, "Functional '%s' does not provide an implementation of lxc\n",
              info->name);
      exit(1);
    }
    check_out_var(v4rho3sigma);
    check_out_var(v4rho2sigma2);
    check_out_var(v4rhosigma3);
    check_out_var(v4sigma4);
  }
}